

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeExtract.cpp
# Opt level: O1

void __thiscall cali::AttributeExtract::~AttributeExtract(AttributeExtract *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  p_Var1 = (this->mP).
           super___shared_ptr<cali::AttributeExtract::AttributeExtractImpl,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->mP).
  super___shared_ptr<cali::AttributeExtract::AttributeExtractImpl,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->mP).
  super___shared_ptr<cali::AttributeExtract::AttributeExtractImpl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->mP).
           super___shared_ptr<cali::AttributeExtract::AttributeExtractImpl,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    return;
  }
  return;
}

Assistant:

AttributeExtract::~AttributeExtract()
{
    mP.reset();
}